

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.c
# Opt level: O1

_Bool TransformerDestroy(Transformer *transformer)

{
  if (transformer == (Transformer *)0x0) {
    TransformerDestroy_cold_1();
  }
  else {
    MatrixDestroy(transformer->matrix);
    MatrixDestroy(transformer->inverseMatrix);
    free(transformer);
  }
  return transformer != (Transformer *)0x0;
}

Assistant:

bool TransformerDestroy(Transformer *transformer) {
  if (transformer == NULL) {
#ifndef NDEBUG
    fprintf(stderr, "%s: trying to free null pointer, ignored.\n", __FUNCTION_NAME__);
#endif
    return false;
  }
  MatrixDestroy(transformer->matrix);
  MatrixDestroy(transformer->inverseMatrix);
  free(transformer);
  return true;
}